

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

RangeList * __thiscall SoapySDR::Device::getFrequencyRange(Device *this,int dir,size_t chan)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  double *pdVar8;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *pvVar9;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long *in_RSI;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *in_RDI;
  double dVar10;
  Range *range;
  size_t range_i;
  double subRangeHigh;
  double subRangeLow;
  RangeList subRange;
  size_t comp_i;
  double bw;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  RangeList *ranges;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *in_stack_fffffffffffffec0;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *in_stack_fffffffffffffed0;
  Range local_c0;
  Range *local_a8;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined1 local_78 [24];
  ulong local_60;
  double local_58;
  undefined1 local_3d;
  undefined4 local_3c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined8 local_20;
  undefined4 local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  (**(code **)(*in_RSI + 0x1d8))(&local_38,in_RSI,in_EDX,in_RCX);
  bVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffed0);
  uVar3 = local_14;
  uVar2 = local_20;
  if (bVar4) {
    memset(in_RDI,0,0x18);
    std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::vector
              ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)0x12fc31);
  }
  else {
    local_3d = 0;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffec0);
    (**(code **)(*in_RSI + 0x1e8))(in_RDI,in_RSI,uVar3,uVar2,pvVar5);
    local_58 = (double)(**(code **)(*in_RSI + 0x220))(in_RSI,local_14,local_20);
    for (local_60 = 1; uVar1 = local_60,
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_38), uVar3 = local_14, uVar2 = local_20, uVar1 < sVar6;
        local_60 = local_60 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_38,local_60);
      (**(code **)(*in_RSI + 0x1e8))(local_78,in_RSI,uVar3,uVar2,pvVar5);
      bVar4 = std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::empty
                        (in_stack_fffffffffffffed0);
      if (bVar4) {
        local_3c = 4;
      }
      else {
        pvVar7 = std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::front
                           (in_stack_fffffffffffffec0);
        local_80 = Range::minimum(pvVar7);
        if (0.0 < local_58) {
          local_88 = local_58 * -0.5;
          pdVar8 = std::max<double>(&local_88,&local_80);
          local_80 = *pdVar8;
        }
        pvVar7 = std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::back
                           (in_stack_fffffffffffffec0);
        local_90 = Range::maximum(pvVar7);
        if (0.0 < local_58) {
          local_98 = local_58 * 0.5;
          pdVar8 = std::min<double>(&local_98,&local_90);
          local_90 = *pdVar8;
        }
        local_a0 = (vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)0x0;
        while (in_stack_fffffffffffffed0 = local_a0,
              pvVar9 = (vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)
                       std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::size(in_RDI),
              in_stack_fffffffffffffed0 < pvVar9) {
          local_a8 = std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::operator[]
                               (in_RDI,(size_type)local_a0);
          dVar10 = Range::minimum(local_a8);
          dVar10 = dVar10 + local_80;
          in_stack_fffffffffffffec0 =
               (vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)Range::maximum(local_a8)
          ;
          Range::Range(&local_c0,dVar10,(double)in_stack_fffffffffffffec0 + local_90,0.0);
          local_a8->_min = local_c0._min;
          local_a8->_max = local_c0._max;
          local_a8->_step = local_c0._step;
          local_a0 = (vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)
                     ((long)&(local_a0->
                             super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
                             _M_impl.super__Vector_impl_data._M_start + 1);
        }
        local_3c = 0;
      }
      std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector
                (in_stack_fffffffffffffed0);
    }
    local_3d = 1;
  }
  local_3c = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffed0);
  return in_RDI;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getFrequencyRange(const int dir, const size_t chan) const
{
    //get a list of tunable components
    const auto comps = this->listFrequencies(dir, chan);
    if (comps.empty()) return SoapySDR::RangeList();

    //get the range list for the RF component
    auto ranges = this->getFrequencyRange(dir, chan, comps.front());

    //use bandwidth setting to clip the range
    const double bw = this->getBandwidth(dir, chan);

    //add to the range list given subsequent components
    for (size_t comp_i = 1; comp_i < comps.size(); comp_i++)
    {
        const auto subRange = this->getFrequencyRange(dir, chan, comps[comp_i]);
        if (subRange.empty()) continue;

        double subRangeLow = subRange.front().minimum();
        if (bw > 0.0) subRangeLow = std::max(-bw/2, subRangeLow);

        double subRangeHigh = subRange.back().maximum();
        if (bw > 0.0) subRangeHigh = std::min(bw/2, subRangeHigh);

        for (size_t range_i = 0; range_i < ranges.size(); range_i++)
        {
            SoapySDR::Range &range = ranges[range_i];
            range = SoapySDR::Range(
                range.minimum() + subRangeLow,
                range.maximum() + subRangeHigh);
        }
    }

    return ranges;
}